

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O2

size_t __thiscall wabt::anon_unknown_0::CWriter::BeginTry(CWriter *this,Block *block)

{
  FuncSignature *sig;
  pointer *ppTVar1;
  pointer pLVar2;
  pointer this_00;
  __type _Var3;
  ulong uVar4;
  ulong uVar5;
  pointer pTVar6;
  pointer pTVar7;
  pointer pTVar8;
  long lVar9;
  char (*args) [16];
  _Tp_alloc_type *__alloc;
  Newline *u;
  Newline *u_00;
  Newline *u_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *u_02;
  OpenBrace *u_03;
  string *t;
  undefined1 in_R8B;
  undefined7 in_register_00000081;
  size_t mark;
  ulong uVar10;
  string_view name;
  allocator<char> local_69;
  pointer local_68;
  Block *local_60;
  long local_58;
  string tlabel;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&tlabel,"exceptions",&local_69);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&this->func_includes_,&tlabel);
  std::__cxx11::string::_M_dispose();
  Write(this);
  name._M_str = (block->label)._M_dataplus._M_p;
  name._M_len = (block->label)._M_string_length;
  (anonymous_namespace)::CWriter::DefineLabelName_abi_cxx11_(&tlabel,(CWriter *)this,name);
  WriteData(this,"WASM_RT_UNWIND_TARGET *",0x17);
  WriteData(this,tlabel._M_dataplus._M_p,tlabel._M_string_length);
  (anonymous_namespace)::CWriter::Write<char_const(&)[45],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [45])"_outer_target = wasm_rt_get_unwind_target();",u);
  WriteData(this,"WASM_RT_UNWIND_TARGET ",0x16);
  WriteData(this,tlabel._M_dataplus._M_p,tlabel._M_string_length);
  (anonymous_namespace)::CWriter::Write<char_const(&)[16],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [16])"_unwind_target;",u_00);
  WriteData(this,"if (!wasm_rt_try(",0x11);
  WriteData(this,tlabel._M_dataplus._M_p,tlabel._M_string_length);
  WriteData(this,"_unwind_target)) ",0x11);
  Write(this);
  sig = &(block->decl).sig;
  DropTypes(this,(ulong)((long)(block->decl).sig.param_types.
                               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(block->decl).sig.param_types.
                              super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 3 & 0xffffffff);
  local_58 = (long)(this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                   _M_impl.super__Vector_impl_data._M_start;
  PushLabel(this,Try,&block->label,sig,(bool)in_R8B);
  PushTypes(this,&sig->param_types);
  WriteData(this,"wasm_rt_set_unwind_target(&",0x1b);
  WriteData(this,tlabel._M_dataplus._M_p,tlabel._M_string_length);
  (anonymous_namespace)::CWriter::Write<char_const(&)[17],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [17])"_unwind_target);",u_01);
  pTVar6 = (this->try_catch_stack_).
           super__Vector_base<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pTVar8 = (this->try_catch_stack_).
           super__Vector_base<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  args = (char (*) [16])((long)pTVar8 - (long)pTVar6);
  uVar4 = (long)args / 0x30;
  if (pTVar8 == (this->try_catch_stack_).
                super__Vector_base<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_60 = block;
    if (args == (char (*) [16])0x7fffffffffffffe0) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar5 = 1;
    if (pTVar8 != pTVar6) {
      uVar5 = uVar4;
    }
    uVar10 = uVar5 + uVar4;
    __alloc = (_Tp_alloc_type *)0x2aaaaaaaaaaaaaa;
    if (0x2aaaaaaaaaaaaa9 < uVar10) {
      uVar10 = 0x2aaaaaaaaaaaaaa;
    }
    if (CARRY8(uVar5,uVar4)) {
      uVar10 = 0x2aaaaaaaaaaaaaa;
    }
    local_68 = pTVar6;
    if (uVar10 == 0) {
      pTVar6 = (pointer)0x0;
    }
    else {
      pTVar6 = (pointer)operator_new(uVar10 * 0x30);
    }
    std::__cxx11::string::string((string *)(pTVar6 + uVar4),(string *)&tlabel);
    this_00 = local_68;
    pTVar6[uVar4].try_catch_stack_size = uVar4;
    pTVar6[uVar4].used = false;
    pTVar7 = std::
             vector<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
             ::_S_relocate(local_68,pTVar8,pTVar6,__alloc);
    pTVar8 = std::
             vector<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
             ::_S_relocate(pTVar8,pTVar8,pTVar7 + 1,__alloc);
    lVar9 = (long)(this->try_catch_stack_).
                  super__Vector_base<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)this_00;
    args = (char (*) [16])0x30;
    std::
    _Vector_base<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
    ::_M_deallocate((_Vector_base<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
                     *)this_00,(pointer)(lVar9 / 0x30),lVar9 % 0x30);
    (this->try_catch_stack_).
    super__Vector_base<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
    ._M_impl.super__Vector_impl_data._M_start = pTVar6;
    (this->try_catch_stack_).
    super__Vector_base<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
    ._M_impl.super__Vector_impl_data._M_finish = pTVar8;
    (this->try_catch_stack_).
    super__Vector_base<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pTVar6 + uVar10;
    block = local_60;
  }
  else {
    std::__cxx11::string::string((string *)pTVar8,(string *)&tlabel);
    pTVar8->try_catch_stack_size = uVar4;
    pTVar8->used = false;
    ppTVar1 = &(this->try_catch_stack_).
               super__Vector_base<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppTVar1 = *ppTVar1 + 1;
  }
  mark = local_58 >> 3;
  Write(this,&block->exprs);
  ResetTypeStack(this,mark);
  t = &tlabel;
  (anonymous_namespace)::CWriter::
  Write<char_const(&)[27],std::__cxx11::string_const&,char_const(&)[16],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [27])t,u_02,args,
             (Newline *)CONCAT71(in_register_00000081,in_R8B));
  Write(this);
  (anonymous_namespace)::CWriter::Write<char_const(&)[7],wabt::(anonymous_namespace)::OpenBrace>
            ((CWriter *)this,(char (*) [7])t,u_03);
  _Var3 = std::operator==((this->label_stack_).
                          super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
                          ._M_impl.super__Vector_impl_data._M_finish[-1].name,&block->label);
  if (_Var3) {
    pLVar2 = (this->label_stack_).
             super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pLVar2[-1].label_type == Try) {
      pLVar2[-1].label_type = Catch;
      if ((this->try_catch_stack_).
          super__Vector_base<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].used == true) {
        WriteData(this,tlabel._M_dataplus._M_p,tlabel._M_string_length);
        WriteData(this,"_catch:;",8);
        Write(this);
      }
      std::__cxx11::string::_M_dispose();
      return mark;
    }
    __assert_fail("label_stack_.back().label_type == LabelType::Try",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                  ,0xd0f,"size_t wabt::(anonymous namespace)::CWriter::BeginTry(const Block &)");
  }
  __assert_fail("label_stack_.back().name == block.label",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                ,0xd0e,"size_t wabt::(anonymous namespace)::CWriter::BeginTry(const Block &)");
}

Assistant:

size_t CWriter::BeginTry(const Block& block) {
  func_includes_.insert("exceptions");
  Write(OpenBrace()); /* beginning of try-catch or try_table */
  const std::string tlabel = DefineLabelName(block.label);
  Write("WASM_RT_UNWIND_TARGET *", tlabel,
        "_outer_target = wasm_rt_get_unwind_target();", Newline());
  Write("WASM_RT_UNWIND_TARGET ", tlabel, "_unwind_target;", Newline());
  Write("if (!wasm_rt_try(", tlabel, "_unwind_target)) ");
  Write(OpenBrace()); /* beginning of try or try_table block */
  DropTypes(block.decl.GetNumParams());
  const size_t mark = MarkTypeStack();
  PushLabel(LabelType::Try, block.label, block.decl.sig);
  PushTypes(block.decl.sig.param_types);
  Write("wasm_rt_set_unwind_target(&", tlabel, "_unwind_target);", Newline());
  PushTryCatch(tlabel);
  Write(block.exprs);
  ResetTypeStack(mark);
  Write("wasm_rt_set_unwind_target(", tlabel, "_outer_target);", Newline());
  Write(CloseBrace());          /* end of try or try_table block */
  Write(" else ", OpenBrace()); /* beginning of catch blocks or delegate */
  assert(label_stack_.back().name == block.label);
  assert(label_stack_.back().label_type == LabelType::Try);
  label_stack_.back().label_type = LabelType::Catch;
  if (try_catch_stack_.back().used) {
    Write(tlabel, "_catch:;", Newline());
  }

  return mark;
}